

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

char * ssl_msg_type(int ssl_ver,int msg)

{
  int msg_local;
  int ssl_ver_local;
  
  if (ssl_ver == 3) {
    switch(msg) {
    case 0:
      _msg_local = "Hello request";
      break;
    case 1:
      _msg_local = "Client hello";
      break;
    case 2:
      _msg_local = "Server hello";
      break;
    default:
      goto LAB_00175550;
    case 4:
      _msg_local = "Newsession Ticket";
      break;
    case 0xb:
      _msg_local = "Certificate";
      break;
    case 0xc:
      _msg_local = "Server key exchange";
      break;
    case 0xd:
      _msg_local = "Request CERT";
      break;
    case 0xe:
      _msg_local = "Server finished";
      break;
    case 0xf:
      _msg_local = "CERT verify";
      break;
    case 0x10:
      _msg_local = "Client key exchange";
      break;
    case 0x14:
      _msg_local = "Finished";
      break;
    case 0x16:
      _msg_local = "Certificate Status";
    }
  }
  else {
LAB_00175550:
    _msg_local = "Unknown";
  }
  return _msg_local;
}

Assistant:

static const char *ssl_msg_type(int ssl_ver, int msg)
{
#ifdef SSL2_VERSION_MAJOR
  if(ssl_ver == SSL2_VERSION_MAJOR) {
    switch(msg) {
      case SSL2_MT_ERROR:
        return "Error";
      case SSL2_MT_CLIENT_HELLO:
        return "Client hello";
      case SSL2_MT_CLIENT_MASTER_KEY:
        return "Client key";
      case SSL2_MT_CLIENT_FINISHED:
        return "Client finished";
      case SSL2_MT_SERVER_HELLO:
        return "Server hello";
      case SSL2_MT_SERVER_VERIFY:
        return "Server verify";
      case SSL2_MT_SERVER_FINISHED:
        return "Server finished";
      case SSL2_MT_REQUEST_CERTIFICATE:
        return "Request CERT";
      case SSL2_MT_CLIENT_CERTIFICATE:
        return "Client CERT";
    }
  }
  else
#endif
  if(ssl_ver == SSL3_VERSION_MAJOR) {
    switch(msg) {
      case SSL3_MT_HELLO_REQUEST:
        return "Hello request";
      case SSL3_MT_CLIENT_HELLO:
        return "Client hello";
      case SSL3_MT_SERVER_HELLO:
        return "Server hello";
#ifdef SSL3_MT_NEWSESSION_TICKET
      case SSL3_MT_NEWSESSION_TICKET:
        return "Newsession Ticket";
#endif
      case SSL3_MT_CERTIFICATE:
        return "Certificate";
      case SSL3_MT_SERVER_KEY_EXCHANGE:
        return "Server key exchange";
      case SSL3_MT_CLIENT_KEY_EXCHANGE:
        return "Client key exchange";
      case SSL3_MT_CERTIFICATE_REQUEST:
        return "Request CERT";
      case SSL3_MT_SERVER_DONE:
        return "Server finished";
      case SSL3_MT_CERTIFICATE_VERIFY:
        return "CERT verify";
      case SSL3_MT_FINISHED:
        return "Finished";
#ifdef SSL3_MT_CERTIFICATE_STATUS
      case SSL3_MT_CERTIFICATE_STATUS:
        return "Certificate Status";
#endif
    }
  }
  return "Unknown";
}